

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osEvent.cpp
# Opt level: O0

void osEvent::dump_info(ostream *out)

{
  osEvent *this;
  osThread *this_00;
  _Setw _Var1;
  ostream *poVar2;
  char *pcVar3;
  osThread *thread;
  osEvent *e;
  uint32_t i;
  ostream *out_local;
  
  std::operator<<(out,"Event                         |Thread Name         |State\n");
  std::operator<<(out,"------------------------------+--------------------+------------\n");
  for (e._4_4_ = 0; e._4_4_ < 0x14; e._4_4_ = e._4_4_ + 1) {
    this = InstanceList[e._4_4_];
    if (this != (osEvent *)0x0) {
      this_00 = this->pending;
      _Var1 = std::setw(0x1e);
      poVar2 = std::operator<<(out,_Var1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
      pcVar3 = GetName(this);
      poVar2 = std::operator<<(poVar2,pcVar3);
      _Var1 = std::setw(0);
      poVar2 = std::operator<<(poVar2,_Var1);
      std::operator<<(poVar2,"|");
      if (this_00 == (osThread *)0x0) {
        _Var1 = std::setw(0x14);
        poVar2 = std::operator<<(out,_Var1);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
        poVar2 = std::operator<<(poVar2,"");
        _Var1 = std::setw(0);
        poVar2 = std::operator<<(poVar2,_Var1);
        std::operator<<(poVar2,"|");
        _Var1 = std::setw(10);
        poVar2 = std::operator<<(out,_Var1);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
        poVar2 = std::operator<<(poVar2,"");
        _Var1 = std::setw(0);
        poVar2 = std::operator<<(poVar2,_Var1);
        std::operator<<(poVar2,"\n");
      }
      else {
        _Var1 = std::setw(0x14);
        poVar2 = std::operator<<(out,_Var1);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
        pcVar3 = osThread::GetName(this_00);
        poVar2 = std::operator<<(poVar2,pcVar3);
        _Var1 = std::setw(0);
        poVar2 = std::operator<<(poVar2,_Var1);
        std::operator<<(poVar2,"|");
        _Var1 = std::setw(10);
        poVar2 = std::operator<<(out,_Var1);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
        poVar2 = std::operator<<(poVar2,"");
        _Var1 = std::setw(0);
        poVar2 = std::operator<<(poVar2,_Var1);
        std::operator<<(poVar2,"\n");
      }
    }
  }
  return;
}

Assistant:

void osEvent::dump_info(std::ostream& out)
{
    uint32_t i;

    out << "Event                         |Thread Name         |State\n";
    out << "------------------------------+--------------------+------------\n";
    for (i = 0; i < INSTANCE_MAX; i++)
    {
        osEvent* e = InstanceList[i];
        if (e)
        {
            osThread* thread = e->pending;
            out << std::setw(30) << std::left << e->GetName() << std::setw(0) << "|";
            if (thread)
            {
                out << std::setw(20) << std::left << thread->GetName() << std::setw(0) << "|";
                out << std::setw(10) << std::left << "" << std::setw(0) << "\n";
            }
            else
            {
                out << std::setw(20) << std::left << "" << std::setw(0) << "|";
                out << std::setw(10) << std::left << "" << std::setw(0) << "\n";
            }
        }
    }
}